

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_capi_profiling.cpp
# Opt level: O2

void TraverseTree(duckdb_profiling_info profiling_info,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 *cumulative_counter,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 *cumulative_result,idx_t depth)

{
  duckdb_profiling_info profiling_info_00;
  idx_t i;
  ulong uVar1;
  idx_t child_count;
  int local_cc;
  BinaryExpr<const_unsigned_long_&,_const_int_&> local_c8;
  SourceLineInfo local_98;
  AssertionHandler catchAssertionHandler;
  StringRef local_40;
  
  RetrieveMetrics(profiling_info,cumulative_counter,cumulative_result,depth);
  child_count = duckdb_profiling_info_get_child_count(profiling_info);
  if (depth == 0) {
    local_c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x433f41;
    local_c8.super_ITransientExpression.m_isBinaryExpression = true;
    local_c8.super_ITransientExpression.m_result = false;
    local_c8.super_ITransientExpression._10_6_ = 0;
    local_98.file =
         "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/capi/test_capi_profiling.cpp"
    ;
    local_98.line = 0x5f;
    Catch::StringRef::StringRef(&local_40,"child_count != 0");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_c8,&local_98,local_40,Normal);
    local_cc = 0;
    local_98.file = (char *)&child_count;
    Catch::ExprLhs<unsigned_long_const&>::operator!=
              (&local_c8,(ExprLhs<unsigned_long_const&> *)&local_98,&local_cc);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8.super_ITransientExpression)
    ;
    Catch::ITransientExpression::~ITransientExpression(&local_c8.super_ITransientExpression);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  for (uVar1 = 0; uVar1 < child_count; uVar1 = uVar1 + 1) {
    profiling_info_00 = (duckdb_profiling_info)duckdb_profiling_info_get_child(profiling_info,uVar1)
    ;
    TraverseTree(profiling_info_00,cumulative_counter,cumulative_result,depth + 1);
  }
  return;
}

Assistant:

void TraverseTree(duckdb_profiling_info profiling_info, duckdb::map<string, double> &cumulative_counter,
                  duckdb::map<string, double> &cumulative_result, const idx_t depth) {

	RetrieveMetrics(profiling_info, cumulative_counter, cumulative_result, depth);

	// Recurse into the child node.
	auto child_count = duckdb_profiling_info_get_child_count(profiling_info);
	if (depth == 0) {
		REQUIRE(child_count != 0);
	}

	for (idx_t i = 0; i < child_count; i++) {
		auto child = duckdb_profiling_info_get_child(profiling_info, i);
		TraverseTree(child, cumulative_counter, cumulative_result, depth + 1);
	}
}